

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader_impl.c
# Opt level: O0

loader_impl_mock_function mock_function_create(loader_impl_mock_handle mock_handle)

{
  loader_impl_mock_handle in_RDI;
  loader_impl_mock_function mock_function;
  loader_impl_mock_function local_8;
  
  local_8 = (loader_impl_mock_function)malloc(0x10);
  if (local_8 == (loader_impl_mock_function)0x0) {
    local_8 = (loader_impl_mock_function)0x0;
  }
  else {
    local_8->mock_handle = in_RDI;
    local_8->function_mock_data = (void *)0x0;
  }
  return local_8;
}

Assistant:

loader_impl_mock_function mock_function_create(loader_impl_mock_handle mock_handle)
{
	loader_impl_mock_function mock_function = malloc(sizeof(struct loader_impl_mock_function_type));

	if (mock_function != NULL)
	{
		mock_function->mock_handle = mock_handle;

		mock_function->function_mock_data = NULL;

		return mock_function;
	}

	return NULL;
}